

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

string * __thiscall
picojson::parse_abi_cxx11_(string *__return_storage_ptr__,picojson *this,value *out,istream *is)

{
  istreambuf_iterator<char,_std::char_traits<char>_> local_38;
  istreambuf_iterator<char,_std::char_traits<char>_> local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38._M_sbuf = *(streambuf_type **)((long)&out[0xe].u_ + *(long *)(*(long *)out + -0x18));
  local_38._M_c = -1;
  local_28._M_sbuf = (streambuf_type *)0x0;
  local_28._M_c = -1;
  parse<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((value *)this,&local_38,&local_28,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::string parse(value& out, std::istream& is) {
    std::string err;
    parse(out, std::istreambuf_iterator<char>(is.rdbuf()),
      std::istreambuf_iterator<char>(), &err);
    return err;
  }